

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

void SharpYUVFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint16_t uVar5;
  long in_RCX;
  int in_EDX;
  short *in_RSI;
  short *in_RDI;
  long in_R8;
  int v1;
  int v0;
  int i;
  int local_2c;
  short *local_10;
  short *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    sVar1 = local_8[1];
    sVar2 = *local_8;
    sVar3 = local_10[1];
    sVar4 = *local_10;
    uVar5 = clip_y((uint)*(ushort *)(in_RCX + (long)(local_2c << 1) * 2) +
                   (*local_8 * 9 + local_8[1] * 3 + *local_10 * 3 + (int)local_10[1] + 8 >> 4));
    *(uint16_t *)(in_R8 + (long)(local_2c << 1) * 2) = uVar5;
    uVar5 = clip_y((uint)*(ushort *)(in_RCX + (long)(local_2c * 2 + 1) * 2) +
                   (sVar1 * 9 + sVar2 * 3 + sVar3 * 3 + (int)sVar4 + 8 >> 4));
    *(uint16_t *)(in_R8 + (long)(local_2c * 2 + 1) * 2) = uVar5;
    local_8 = local_8 + 1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out) {
  int i;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}